

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<int>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  GetterXsYs<int> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImPlotContext *pIVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar14 = GImPlot;
  pGVar9 = this->Getter;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  lVar15 = (long)(((pGVar9->Offset + prim + 1) % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride;
  iVar7 = *(int *)((long)pGVar9->Ys + lVar15);
  dVar18 = log10((double)*(int *)((long)pGVar9->Xs + lVar15) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar14->LogDenX;
  pIVar11 = pIVar14->CurrentPlot;
  dVar3 = (pIVar11->XAxis).Range.Min;
  dVar4 = (pIVar11->XAxis).Range.Max;
  dVar19 = log10((double)iVar7 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar14->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar7].Range.Min;
  fVar22 = (float)((((double)(float)(dVar18 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar11->XAxis).Range.Min) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar7].Min.x);
  fVar23 = (float)((((double)(float)(dVar19 / pIVar14->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar14->My[iVar7] + (double)pIVar14->PixelRange[iVar7].Min.y);
  fVar21 = (this->P1).x;
  fVar24 = (this->P1).y;
  fVar20 = fVar24;
  if (fVar23 <= fVar24) {
    fVar20 = fVar23;
  }
  bVar16 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(-(uint)(fVar23 <= fVar24) & (uint)fVar24 |
                      ~-(uint)(fVar23 <= fVar24) & (uint)fVar23), pfVar1 = &(cull_rect->Min).y,
     bVar16 = false, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar21;
    if (fVar22 <= fVar21) {
      fVar20 = fVar22;
    }
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar22 <= fVar21) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar21) & (uint)fVar21);
      bVar16 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar20 = this->Weight;
    IVar8 = this->Col;
    IVar6 = *uv;
    fVar21 = fVar22 - fVar21;
    fVar24 = fVar23 - fVar24;
    fVar17 = fVar21 * fVar21 + fVar24 * fVar24;
    if (0.0 < fVar17) {
      if (fVar17 < 0.0) {
        fVar17 = sqrtf(fVar17);
      }
      else {
        fVar17 = SQRT(fVar17);
      }
      fVar21 = fVar21 * (1.0 / fVar17);
      fVar24 = fVar24 * (1.0 / fVar17);
    }
    fVar20 = fVar20 * 0.5;
    fVar21 = fVar21 * fVar20;
    fVar20 = fVar20 * fVar24;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = (this->P1).x + fVar20;
    (pIVar12->pos).y = (this->P1).y - fVar21;
    pIVar12->uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar8;
    pIVar12[1].pos.x = fVar20 + fVar22;
    pIVar12[1].pos.y = fVar23 - fVar21;
    pIVar12[1].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar8;
    pIVar12[2].pos.x = fVar22 - fVar20;
    pIVar12[2].pos.y = fVar21 + fVar23;
    pIVar12[2].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar8;
    pIVar12[3].pos.x = (this->P1).x - fVar20;
    pIVar12[3].pos.y = fVar21 + (this->P1).y;
    pIVar12[3].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar6.y = fVar23;
  IVar6.x = fVar22;
  this->P1 = IVar6;
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }